

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O2

void speech_prog_elven_down(ROOM_INDEX_DATA *room,CHAR_DATA *ch,char *speech)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  CHAR_DATA **ppCVar3;
  AFFECT_DATA af;
  ROOM_AFFECT_DATA raf;
  
  bVar2 = is_npc(ch);
  if (!bVar2) {
    bVar2 = str_cmp(speech,"hakri gwenidill mafre finae");
    if (!bVar2) {
      bVar2 = is_affected_room(ch->in_room,(int)gsn_rprog_elven_down);
      if (!bVar2) {
        init_affect_room(&raf);
        raf.where = 0;
        raf.type = gsn_rprog_elven_down;
        raf.aftype = 7;
        raf.duration = 0;
        affect_to_room(ch->in_room,&raf);
        act("A chill wind blows through the room, extinguishing the candle.",ch,(void *)0x0,
            (void *)0x0,3);
        act("A chill wind blows through the room, extinguishing the candle.",ch,(void *)0x0,
            (void *)0x0,0);
        ppCVar3 = &ch->in_room->people;
        while (pCVar1 = *ppCVar3, pCVar1 != (CHAR_DATA *)0x0) {
          init_affect(&af);
          af.where = 0;
          af.aftype = 5;
          af.duration = 0;
          af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
          af.end_fun = rprog_elven_down_end;
          new_affect_to_char(ch,&af);
          ppCVar3 = &pCVar1->next_in_room;
        }
      }
    }
  }
  return;
}

Assistant:

void speech_prog_elven_down(ROOM_INDEX_DATA *room, CHAR_DATA *ch, char *speech)
{
	AFFECT_DATA af;
	ROOM_AFFECT_DATA raf;
	CHAR_DATA *ich = nullptr;

	if (is_npc(ch))
		return;

	if (!str_cmp(speech, "hakri gwenidill mafre finae"))
	{
		if (is_affected_room(ch->in_room, gsn_rprog_elven_down))
			return;

		init_affect_room(&raf);
		raf.where = TO_ROOM_AFFECTS;
		raf.type = gsn_rprog_elven_down;
		raf.aftype = AFT_TIMER;
		raf.duration = 0;
		affect_to_room(ch->in_room, &raf);

		act("A chill wind blows through the room, extinguishing the candle.", ch, 0, 0, TO_CHAR);
		act("A chill wind blows through the room, extinguishing the candle.", ch, 0, 0, TO_ROOM);

		for (ich = ch->in_room->people; ich != nullptr; ich = ich->next_in_room)
		{
			// Small char affect that will restore the original light after a tick.
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.duration = 0;

			SET_BIT(af.bitvector, AFF_BLIND);

			af.end_fun = rprog_elven_down_end;
			new_affect_to_char(ch, &af);
		}
	}
}